

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_tec_part(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  REF_DBL *scalar_00;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *scalar;
  REF_LONG ncell;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_CELL pRStack_38;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  pRStack_38 = ref_grid->cell[3];
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  uVar1 = ref_node_synchronize_globals((REF_NODE)ref_cell);
  if (uVar1 == 0) {
    uVar1 = ref_grid_compact_cell_nodes
                      ((REF_GRID_conflict)filename_local,pRStack_38,(REF_GLOB *)&l2c,
                       (REF_LONG *)&scalar,(REF_GLOB **)&ncell);
    if (uVar1 == 0) {
      ref_node = (REF_NODE)0x0;
      if (*(int *)(*(long *)filename_local + 4) == 0) {
        ref_node = (REF_NODE)fopen((char *)file,"w");
        if ((FILE *)ref_node == (FILE *)0x0) {
          printf("unable to open %s\n",file);
        }
        if (ref_node == (REF_NODE)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x418,"ref_gather_tec_part","unable to open file");
          return 2;
        }
        fprintf((FILE *)ref_node,"title=\"tecplot refine partition file\"\n");
        fprintf((FILE *)ref_node,"variables = \"x\" \"y\" \"z\" \"p\" \"a\"\n");
        fprintf((FILE *)ref_node,
                "zone t=\"surf\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",l2c,scalar
                ,"point","fetriangle");
      }
      if (ref_cell->last_node_is_an_id * 2 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x423,"ref_gather_tec_part","malloc scalar of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        scalar_00 = (REF_DBL *)malloc((long)(ref_cell->last_node_is_an_id << 1) << 3);
        if (scalar_00 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x423,"ref_gather_tec_part","malloc scalar of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (nnode._4_4_ = 0; nnode._4_4_ < ref_cell->last_node_is_an_id;
              nnode._4_4_ = nnode._4_4_ + 1) {
            if (((-1 < nnode._4_4_) && (nnode._4_4_ < ref_cell->last_node_is_an_id)) &&
               (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)nnode._4_4_ * 8))) {
              scalar_00[nnode._4_4_ << 1] =
                   (double)*(int *)(*(long *)&ref_cell->n + (long)nnode._4_4_ * 4);
              scalar_00[nnode._4_4_ * 2 + 1] =
                   (double)*(int *)(*(long *)&ref_cell->blank + (long)nnode._4_4_ * 4);
            }
          }
          uVar1 = ref_gather_node_tec_part
                            ((REF_NODE)ref_cell,(REF_GLOB)l2c,(REF_GLOB *)ncell,2,scalar_00,
                             (FILE *)ref_node);
          if (uVar1 == 0) {
            uVar1 = ref_gather_cell_tec((REF_NODE)ref_cell,pRStack_38,(REF_LONG)scalar,
                                        (REF_GLOB *)ncell,0,(FILE *)ref_node);
            if (uVar1 == 0) {
              if (*(int *)(*(long *)filename_local + 4) == 0) {
                fclose((FILE *)ref_node);
              }
              if (scalar_00 != (REF_DBL *)0x0) {
                free(scalar_00);
              }
              if (ncell != 0) {
                free((void *)ncell);
              }
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x42b,"ref_gather_tec_part",(ulong)uVar1,"nodes");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x429,"ref_gather_tec_part",(ulong)uVar1,"nodes");
            ref_grid_local._4_4_ = uVar1;
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x412,"ref_gather_tec_part",(ulong)uVar1,"l2c");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x40f,
           "ref_gather_tec_part",(ulong)uVar1,"sync");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_tec_part(REF_GRID ref_grid,
                                       const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_DBL *scalar;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    fprintf(file, "title=\"tecplot refine partition file\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\" \"p\" \"a\"\n");
    fprintf(file,
            "zone t=\"surf\", nodes=" REF_GLOB_FMT
            ", elements=%ld, datapacking=%s, "
            "zonetype=%s\n",
            nnode, ncell, "point", "fetriangle");
  }

  ref_malloc(scalar, 2 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    scalar[0 + 2 * node] = (REF_DBL)ref_node_part(ref_node, node);
    scalar[1 + 2 * node] = (REF_DBL)ref_node_age(ref_node, node);
  }

  RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, 2, scalar, file), "nodes");
  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE, file),
      "nodes");

  if (ref_grid_once(ref_grid)) fclose(file);

  ref_free(scalar);
  ref_free(l2c);

  return REF_SUCCESS;
}